

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixTestProcess.cpp
# Opt level: O2

void __thiscall xs::PosixTestProcess::PosixTestProcess(PosixTestProcess *this)

{
  ThreadedByteBuffer *this_00;
  
  (this->super_TestProcess)._vptr_TestProcess = (_func_int **)&PTR__PosixTestProcess_0012c658;
  this->m_process = (Process *)0x0;
  this->m_processStartTime = 0;
  (this->m_logFileName)._M_dataplus._M_p = (pointer)&(this->m_logFileName).field_2;
  (this->m_logFileName)._M_string_length = 0;
  (this->m_logFileName).field_2._M_local_buf[0] = '\0';
  this_00 = &this->m_infoBuffer;
  de::BlockBuffer<unsigned_char>::BlockBuffer(this_00,0x40,0x80);
  posix::CaseListWriter::CaseListWriter(&this->m_caseListWriter);
  posix::PipeReader::PipeReader(&this->m_stdOutReader,this_00);
  posix::PipeReader::PipeReader(&this->m_stdErrReader,this_00);
  posix::FileReader::FileReader(&this->m_logReader,0x400,0x200);
  return;
}

Assistant:

PosixTestProcess::PosixTestProcess (void)
	: m_process				(DE_NULL)
	, m_processStartTime	(0)
	, m_infoBuffer			(INFO_BUFFER_BLOCK_SIZE, INFO_BUFFER_NUM_BLOCKS)
	, m_stdOutReader		(&m_infoBuffer)
	, m_stdErrReader		(&m_infoBuffer)
	, m_logReader			(LOG_BUFFER_BLOCK_SIZE, LOG_BUFFER_NUM_BLOCKS)
{
}